

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O2

void __thiscall
cppjieba::Trie::CreateTrie
          (Trie *this,
          vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
          *keys,vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>
                *valuePointers)

{
  pointer ppDVar1;
  pointer ppDVar2;
  pointer pLVar3;
  size_t i;
  ulong uVar4;
  pointer pLVar5;
  long lVar6;
  
  ppDVar1 = (valuePointers->
            super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppDVar2 = (valuePointers->
            super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppDVar1 != ppDVar2) {
    pLVar5 = (keys->
             super__Vector_base<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pLVar3 = (keys->
             super__Vector_base<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pLVar5 != pLVar3) {
      if (((long)pLVar3 - (long)pLVar5) / 0x58 != (long)ppDVar2 - (long)ppDVar1 >> 3) {
        __assert_fail("keys.size() == valuePointers.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/Trie.hpp"
                      ,0x96,
                      "void cppjieba::Trie::CreateTrie(const vector<Unicode> &, const vector<const DictUnit *> &)"
                     );
      }
      lVar6 = 0;
      for (uVar4 = 0; uVar4 < (ulong)(((long)pLVar3 - (long)pLVar5) / 0x58); uVar4 = uVar4 + 1) {
        InsertNode(this,(Unicode *)((long)pLVar5->buffer_ + lVar6),
                   (valuePointers->
                   super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar4]);
        pLVar5 = (keys->
                 super__Vector_base<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pLVar3 = (keys->
                 super__Vector_base<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        lVar6 = lVar6 + 0x58;
      }
    }
  }
  return;
}

Assistant:

void CreateTrie(const vector<Unicode>& keys, const vector<const DictUnit*>& valuePointers) {
    if (valuePointers.empty() || keys.empty()) {
      return;
    }
    assert(keys.size() == valuePointers.size());

    for (size_t i = 0; i < keys.size(); i++) {
      InsertNode(keys[i], valuePointers[i]);
    }
  }